

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_color.c
# Opt level: O1

void swap_yuv2yuv420(swap_image_yuv_t *im)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  uchar *puVar4;
  uchar *puVar5;
  uchar *puVar6;
  uchar *puVar7;
  uchar *puVar8;
  uchar *puVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  
  uVar1 = im->h;
  if (uVar1 != 0) {
    uVar2 = im->w;
    puVar4 = im->u;
    puVar6 = im->v;
    puVar7 = puVar6 + uVar2 + 1;
    lVar3 = uVar2 * 2;
    puVar8 = puVar4 + uVar2 + 1;
    puVar9 = puVar6 + 1;
    puVar5 = puVar4 + 1;
    uVar11 = 0;
    do {
      if (uVar2 != 0) {
        lVar12 = 0;
        uVar10 = 0;
        do {
          puVar4[lVar12] =
               (uchar)((uint)puVar8[lVar12 * 2 + -1] +
                       (uint)puVar5[lVar12 * 2] + (uint)puVar5[lVar12 * 2 + -1] +
                       (uint)puVar8[lVar12 * 2] + 2 >> 2);
          puVar6[lVar12] =
               (uchar)((uint)puVar7[lVar12 * 2 + -1] +
                       (uint)puVar9[lVar12 * 2] + (uint)puVar9[lVar12 * 2 + -1] +
                       (uint)puVar7[lVar12 * 2] + 2 >> 2);
          uVar10 = uVar10 + 2;
          lVar12 = lVar12 + 1;
        } while (uVar10 < uVar2);
      }
      uVar11 = uVar11 + 2;
      puVar7 = puVar7 + lVar3;
      puVar8 = puVar8 + lVar3;
      puVar9 = puVar9 + lVar3;
      puVar5 = puVar5 + lVar3;
      puVar4 = puVar4 + (uVar2 >> 1);
      puVar6 = puVar6 + (uVar2 >> 1);
    } while (uVar11 < uVar1);
  }
  return;
}

Assistant:

void swap_yuv2yuv420(swap_image_yuv_t *im) {
    size_t w = im->w, h = im->h, i, j;
    unsigned char *u = im->u, *v = im->v;

    for (j = 0; j < h; j += 2)
        for (i = 0; i < w; i += 2) {
            int val;
            size_t idx = (j / 2) * (w / 2) + (i / 2);

            val = ((int) u[j * w + i] +
                   (int) u[j * w + (i + 1)] + (int) u[(j + 1) * w + i] + (int) u[(j + 1) * w + (i + 1)] + 2) >> 2;
            if (val > 255)
                val = 255;
            u[idx] = val;

            val = ((int) v[j * w + i] +
                   (int) v[j * w + (i + 1)] + (int) v[(j + 1) * w + i] + (int) v[(j + 1) * w + (i + 1)] + 2) >> 2;
            if (val > 255)
                val = 255;
            v[idx] = val;
        }
}